

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O2

void __thiscall slang::ast::Symbol::appendHierarchicalPath(Symbol *this,string *result)

{
  FormatBuffer buffer;
  FormatBuffer local_228;
  
  local_228.buf.super_buffer<char>.ptr_ = local_228.buf.store_;
  local_228.buf.super_buffer<char>.size_ = 0;
  local_228.buf.super_buffer<char>.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_228.buf.super_buffer<char>.capacity_ = 500;
  local_228.showColors = false;
  getHierarchicalPathImpl(this,&local_228);
  if (local_228.buf.super_buffer<char>.size_ == 0) {
    ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)&local_228,"$unit","");
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (result,local_228.buf.super_buffer<char>.ptr_,local_228.buf.super_buffer<char>.size_);
  ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::deallocate
            (&local_228.buf);
  return;
}

Assistant:

void Symbol::appendHierarchicalPath(std::string& result) const {
    FormatBuffer buffer;
    getHierarchicalPathImpl(*this, buffer);
    if (buffer.empty())
        buffer.append("$unit");

    result.append(buffer.data(), buffer.size());
}